

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::printIncrementalStats(Solver *this)

{
  unsigned_long *puVar1;
  long in_RDI;
  
  printf("c---------- Glucose Stats -------------------------\n");
  printf("c restarts              : %lu\n",*(undefined8 *)(in_RDI + 0xe8));
  puVar1 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xd);
  printf("c nb ReduceDB           : %lu\n",*puVar1);
  puVar1 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),7);
  printf("c nb removed Clauses    : %lu\n",*puVar1);
  puVar1 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),10);
  printf("c nb learnts DL2        : %lu\n",*puVar1);
  puVar1 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xb);
  printf("c nb learnts size 2     : %lu\n",*puVar1);
  puVar1 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0xc);
  printf("c nb learnts size 1     : %lu\n",*puVar1);
  printf("c conflicts             : %lu\n",*(undefined8 *)(in_RDI + 0x100));
  printf("c decisions             : %lu\n",*(undefined8 *)(in_RDI + 0xf0));
  printf("c propagations          : %lu\n",*(undefined8 *)(in_RDI + 0xf8));
  printf("\nc SAT Calls             : %d in %g seconds\n",*(undefined8 *)(in_RDI + 0x470),
         (ulong)*(uint *)(in_RDI + 0x480));
  printf("c UNSAT Calls           : %d in %g seconds\n",*(undefined8 *)(in_RDI + 0x478),
         (ulong)*(uint *)(in_RDI + 0x484));
  printf("c--------------------------------------------------\n");
  return;
}

Assistant:

void Solver::printIncrementalStats() {

    printf("c---------- Glucose Stats -------------------------\n");
    printf("c restarts              : %"
    PRIu64
    "\n", starts);
    printf("c nb ReduceDB           : %"
    PRIu64
    "\n", stats[nbReduceDB]);
    printf("c nb removed Clauses    : %"
    PRIu64
    "\n", stats[nbRemovedClauses]);
    printf("c nb learnts DL2        : %"
    PRIu64
    "\n", stats[nbDL2]);
    printf("c nb learnts size 2     : %"
    PRIu64
    "\n", stats[nbBin]);
    printf("c nb learnts size 1     : %"
    PRIu64
    "\n", stats[nbUn]);

    printf("c conflicts             : %"
    PRIu64
    "\n", conflicts);
    printf("c decisions             : %"
    PRIu64
    "\n", decisions);
    printf("c propagations          : %"
    PRIu64
    "\n", propagations);

    printf("\nc SAT Calls             : %d in %g seconds\n", nbSatCalls, totalTime4Sat);
    printf("c UNSAT Calls           : %d in %g seconds\n", nbUnsatCalls, totalTime4Unsat);

    printf("c--------------------------------------------------\n");
}